

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

void __thiscall duckdb::Pipeline::Pipeline(Pipeline *this,Executor *executor_p)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<duckdb::Pipeline>).__weak_this_.internal.
  super___weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Pipeline>).__weak_this_.internal.
  super___weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->executor = executor_p;
  this->ready = false;
  this->initialized = (__atomic_base<bool>)0x0;
  p_Var1 = &(this->batch_indexes)._M_t._M_impl.super__Rb_tree_header;
  (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  switchD_010444a0::default(&this->source,0,0x90);
  (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Pipeline::Pipeline(Executor &executor_p)
    : executor(executor_p), ready(false), initialized(false), source(nullptr), sink(nullptr) {
}